

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threshold.cpp
# Opt level: O0

int __thiscall ncnn::Threshold::forward_inplace(Threshold *this,Mat *bottom_top_blob,Option *opt)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long *in_RSI;
  long lVar4;
  long in_RDI;
  int i;
  float *ptr;
  int q;
  int size;
  int channels;
  int h;
  int w;
  Mat *m;
  int local_158;
  int local_f4;
  
  iVar1 = *(int *)((long)in_RSI + 0x2c);
  lVar2 = in_RSI[6];
  lVar3 = in_RSI[7];
  for (local_f4 = 0; local_f4 < (int)lVar3; local_f4 = local_f4 + 1) {
    lVar4 = *in_RSI + in_RSI[8] * (long)local_f4 * in_RSI[2];
    for (local_158 = 0; local_158 < iVar1 * (int)lVar2; local_158 = local_158 + 1) {
      *(uint *)(lVar4 + (long)local_158 * 4) =
           -(uint)(*(float *)(in_RDI + 0xd0) < *(float *)(lVar4 + (long)local_158 * 4)) & 0x3f800000
      ;
    }
  }
  return 0;
}

Assistant:

int Threshold::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        for (int i = 0; i < size; i++)
        {
            ptr[i] = ptr[i] > threshold ? 1.f : 0.f;
        }
    }

    return 0;
}